

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

APInt __thiscall llvm::detail::IEEEFloat::convertFloatAPFloatToAPInt(IEEEFloat *this)

{
  bool bVar1;
  uint uVar2;
  integerPart *piVar3;
  undefined8 extraout_RDX;
  IEEEFloat *in_RSI;
  APInt AVar4;
  uint local_20;
  uint local_1c;
  uint32_t mysignificand;
  uint32_t myexponent;
  IEEEFloat *this_local;
  
  if (in_RSI->semantics != (fltSemantics *)semIEEEsingle) {
    __assert_fail("semantics == (const llvm::fltSemantics*)&semIEEEsingle",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xb7d,"APInt llvm::detail::IEEEFloat::convertFloatAPFloatToAPInt() const");
  }
  uVar2 = partCount(in_RSI);
  if (uVar2 == 1) {
    bVar1 = isFiniteNonZero(in_RSI);
    if (bVar1) {
      local_1c = (int)in_RSI->exponent + 0x7f;
      piVar3 = significandParts(in_RSI);
      local_20 = (uint)*piVar3;
      if ((local_1c == 1) && ((*piVar3 & 0x800000) == 0)) {
        local_1c = 0;
      }
    }
    else if ((in_RSI->field_0x12 & 7) == 3) {
      local_1c = 0;
      local_20 = 0;
    }
    else {
      if ((in_RSI->field_0x12 & 7) == 0) {
        local_20 = 0;
      }
      else {
        if ((in_RSI->field_0x12 & 7) != 1) {
          __assert_fail("category == fcNaN && \"Unknown category!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                        ,0xb8e,"APInt llvm::detail::IEEEFloat::convertFloatAPFloatToAPInt() const");
        }
        piVar3 = significandParts(in_RSI);
        local_20 = (uint)*piVar3;
      }
      local_1c = 0xff;
    }
    APInt::APInt((APInt *)this,0x20,
                 (ulong)((uint)((byte)in_RSI->field_0x12 >> 3 & 1) << 0x1f |
                         (local_1c & 0xff) << 0x17 | local_20 & 0x7fffff),false);
    AVar4._8_8_ = extraout_RDX;
    AVar4.U.pVal = (uint64_t *)this;
    return AVar4;
  }
  __assert_fail("partCount()==1",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0xb7e,"APInt llvm::detail::IEEEFloat::convertFloatAPFloatToAPInt() const");
}

Assistant:

APInt IEEEFloat::convertFloatAPFloatToAPInt() const {
  assert(semantics == (const llvm::fltSemantics*)&semIEEEsingle);
  assert(partCount()==1);

  uint32_t myexponent, mysignificand;

  if (isFiniteNonZero()) {
    myexponent = exponent+127; //bias
    mysignificand = (uint32_t)*significandParts();
    if (myexponent == 1 && !(mysignificand & 0x800000))
      myexponent = 0;   // denormal
  } else if (category==fcZero) {
    myexponent = 0;
    mysignificand = 0;
  } else if (category==fcInfinity) {
    myexponent = 0xff;
    mysignificand = 0;
  } else {
    assert(category == fcNaN && "Unknown category!");
    myexponent = 0xff;
    mysignificand = (uint32_t)*significandParts();
  }

  return APInt(32, (((sign&1) << 31) | ((myexponent&0xff) << 23) |
                    (mysignificand & 0x7fffff)));
}